

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O3

void __thiscall cp::LegTrack::getLegTrack(LegTrack *this,double t,Pose *r_leg_pose)

{
  double *pdVar1;
  undefined4 *puVar2;
  LegTrack *pLVar3;
  double dVar4;
  double lent;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  Quat *end;
  Quat *begin;
  ActualDstType actualDst;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Vector2 nex;
  double local_238;
  Quat local_228;
  undefined1 local_208 [112];
  Quat local_198;
  Quat local_178;
  Quat local_158;
  Quat local_138;
  Quat local_118;
  Quat local_f8;
  Quat local_d8;
  Quat local_b8;
  Quat local_98;
  Quat local_78;
  Quat local_58;
  
  if ((*(uint *)(this + 0x444) | 2) == 6) {
    dVar4 = *(double *)(this + 0x618);
    (r_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = *(double *)(this + 0x610);
    (r_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dVar4;
    (r_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = *(double *)(this + 0x620);
    dVar4 = *(double *)(this + 0x638);
    (r_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[0] = *(double *)(this + 0x630);
    (r_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[1] = dVar4;
    dVar4 = *(double *)(this + 0x648);
    (r_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[2] = *(double *)(this + 0x640);
    (r_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[3] = dVar4;
    dVar4 = *(double *)(this + 0x6f8);
    r_leg_pose[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = *(double *)(this + 0x6f0);
    r_leg_pose[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dVar4;
    r_leg_pose[1].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = *(double *)(this + 0x700);
    dVar4 = *(double *)(this + 0x718);
    r_leg_pose[1].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[0] = *(double *)(this + 0x710);
    r_leg_pose[1].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[1] = dVar4;
    dVar4 = *(double *)(this + 0x728);
    r_leg_pose[1].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[2] = *(double *)(this + 0x720);
    r_leg_pose[1].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
    .m_data.array[3] = dVar4;
    return;
  }
  uVar6 = (ulong)*(uint *)(this + 0x440);
  dVar4 = *(double *)(this + 0x1e8);
  if (dVar4 * 0.5 <= t) {
    lent = *(double *)(this + 0x1e0);
    if (dVar4 * 0.5 + lent * 0.5 <= t) {
      if (dVar4 * 0.5 + lent <= t) {
        if (*(double *)(this + 0x1f8) < t) {
          uVar8 = (ulong)(uVar6 == 0);
          goto LAB_00107243;
        }
        uVar8 = (ulong)(uVar6 == 0);
        lVar7 = uVar6 * 0xe0;
        dVar4 = *(double *)(this + lVar7 + 0x260 + 8);
        r_leg_pose[uVar6].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[0] = *(double *)(this + lVar7 + 0x260);
        r_leg_pose[uVar6].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[1] = dVar4;
        r_leg_pose[uVar6].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2] = *(double *)(this + lVar7 + 0x270);
        dVar4 = *(double *)(this + lVar7 + 0x280 + 8);
        r_leg_pose[uVar6].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[0] = *(double *)(this + lVar7 + 0x280);
        r_leg_pose[uVar6].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[1] = dVar4;
        dVar4 = *(double *)(this + lVar7 + 0x290 + 8);
        pdVar1 = r_leg_pose[uVar6].qq.m_coeffs.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 + 2;
        *pdVar1 = *(double *)(this + lVar7 + 0x290);
        pdVar1[1] = dVar4;
        lVar7 = uVar8 * 0xe0;
        dVar4 = *(double *)(this + lVar7 + 0x260 + 8);
        r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[0] = *(double *)(this + lVar7 + 0x260);
        r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[1] = dVar4;
        r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2] = *(double *)(this + lVar7 + 0x270);
        dVar4 = *(double *)(this + lVar7 + 0x280 + 8);
        r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[0] = *(double *)(this + lVar7 + 0x280);
        r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[1] = dVar4;
        pLVar3 = this + lVar7 + 0x290;
        uVar9 = *(undefined4 *)pLVar3;
        uVar10 = *(undefined4 *)(pLVar3 + 4);
        uVar11 = *(undefined4 *)(pLVar3 + 8);
        uVar12 = *(undefined4 *)(pLVar3 + 0xc);
        goto LAB_00106e34;
      }
      uVar8 = (ulong)(uVar6 == 0);
      local_238 = t - dVar4 * 0.5;
      local_208._32_8_ = *(undefined8 *)(this + 0x420);
      local_208._40_8_ = *(undefined8 *)(this + 0x428);
      local_208._16_8_ = *(undefined8 *)(this + 0x430);
      local_208._24_8_ = *(undefined8 *)(this + 0x438);
      interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::lerp
                ((interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_208,
                 (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x90),
                 (Matrix<double,_2,_1,_0,_2,_1> *)(local_208 + 0x20),lent,local_238);
      uVar5 = *(uint *)(this + 0x440);
      dVar4 = interpolation<double>::inter5
                        ((interpolation<double> *)(this + 0x30),local_238 - lent * 0.5);
      r_leg_pose[uVar5].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] = (double)local_208._0_8_;
      r_leg_pose[uVar5].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[1] = (double)local_208._8_8_;
      r_leg_pose[uVar5].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] = dVar4;
      uVar6 = (ulong)*(uint *)(this + 0x440);
      lVar7 = uVar6 * 0xe0;
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar7 + 0x630);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar7 + 0x630 + 8);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar7 + 0x640);
      local_118.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar7 + 0x640 + 8);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar7 + 0x280);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar7 + 0x280 + 8);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar7 + 0x290);
      local_138.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar7 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_118
                 ,&local_138,*(double *)(this + 0x1e0),local_238);
      r_leg_pose[uVar6].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[0];
      r_leg_pose[uVar6].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[1];
      pdVar1 = r_leg_pose[uVar6].qq.m_coeffs.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
               2;
      *pdVar1 = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
      pdVar1[1] = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
      lVar7 = uVar8 * 0xe0;
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar7 + 0x630);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar7 + 0x630 + 8);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar7 + 0x640);
      local_158.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar7 + 0x640 + 8);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar7 + 0x280);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar7 + 0x280 + 8);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar7 + 0x290);
      local_178.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar7 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_158
                 ,&local_178,*(double *)(this + 0x1e0),local_238);
      r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[0];
      r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[1];
      pdVar1 = r_leg_pose[uVar8].qq.m_coeffs.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
               2;
      *pdVar1 = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
      pdVar1[1] = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + 0x240);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + 0x248);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + 0x250);
      local_198.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + 600);
      begin = &local_198;
      uVar9 = *(undefined4 *)(this + 0x220);
      uVar10 = *(undefined4 *)(this + 0x224);
      uVar11 = *(undefined4 *)(this + 0x228);
      uVar12 = *(undefined4 *)(this + 0x22c);
      uVar13 = *(undefined4 *)(this + 0x230);
      uVar14 = *(undefined4 *)(this + 0x234);
      uVar15 = *(undefined4 *)(this + 0x238);
      uVar16 = *(undefined4 *)(this + 0x23c);
      end = (Quat *)(local_208 + 0x50);
    }
    else {
      uVar8 = (ulong)(uVar6 == 0);
      local_238 = t + dVar4 * -0.5;
      local_208._64_8_ = *(undefined8 *)(this + 0x420);
      local_208._72_8_ = *(undefined8 *)(this + 0x428);
      local_208._48_8_ = *(undefined8 *)(this + 0x430);
      local_208._56_8_ = *(undefined8 *)(this + 0x438);
      interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::lerp
                ((interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_208,
                 (Matrix<double,_2,_1,_0,_2,_1> *)(this + 0x90),
                 (Matrix<double,_2,_1,_0,_2,_1> *)(local_208 + 0x40),lent,local_238);
      uVar5 = *(uint *)(this + 0x440);
      dVar4 = interpolation<double>::inter5((interpolation<double> *)this,local_238);
      r_leg_pose[uVar5].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] = (double)local_208._0_8_;
      r_leg_pose[uVar5].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[1] = (double)local_208._8_8_;
      r_leg_pose[uVar5].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] = dVar4;
      uVar6 = (ulong)*(uint *)(this + 0x440);
      lVar7 = uVar6 * 0xe0;
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar7 + 0x630);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar7 + 0x630 + 8);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar7 + 0x640);
      local_58.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar7 + 0x640 + 8);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar7 + 0x280);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar7 + 0x280 + 8);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar7 + 0x290);
      local_78.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar7 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_58,
                 &local_78,*(double *)(this + 0x1e0),local_238);
      r_leg_pose[uVar6].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[0];
      r_leg_pose[uVar6].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[1];
      pdVar1 = r_leg_pose[uVar6].qq.m_coeffs.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
               2;
      *pdVar1 = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
      pdVar1[1] = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
      lVar7 = uVar8 * 0xe0;
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar7 + 0x630);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar7 + 0x630 + 8);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar7 + 0x640);
      local_98.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar7 + 0x640 + 8);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + lVar7 + 0x280);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + lVar7 + 0x280 + 8);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + lVar7 + 0x290);
      local_b8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + lVar7 + 0x290 + 8);
      interpolation<Eigen::Quaternion<double,_0>_>::lerp
                (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),&local_98,
                 &local_b8,*(double *)(this + 0x1e0),local_238);
      r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[0];
      r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array[1];
      pdVar1 = r_leg_pose[uVar8].qq.m_coeffs.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array +
               2;
      *pdVar1 = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array[2];
      pdVar1[1] = local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                  m_storage.m_data.array[3];
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = *(double *)(this + 0x240);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = *(double *)(this + 0x248);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] = *(double *)(this + 0x250);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] = *(double *)(this + 600);
      begin = &local_d8;
      uVar9 = *(undefined4 *)(this + 0x220);
      uVar10 = *(undefined4 *)(this + 0x224);
      uVar11 = *(undefined4 *)(this + 0x228);
      uVar12 = *(undefined4 *)(this + 0x22c);
      uVar13 = *(undefined4 *)(this + 0x230);
      uVar14 = *(undefined4 *)(this + 0x234);
      uVar15 = *(undefined4 *)(this + 0x238);
      uVar16 = *(undefined4 *)(this + 0x23c);
      end = &local_f8;
    }
    *(undefined4 *)
     (end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
     array = uVar9;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 4) = uVar10;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 1) = uVar11;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0xc) = uVar12;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 2) = uVar13;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0x14) = uVar14;
    *(undefined4 *)
     ((end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array + 3) = uVar15;
    *(undefined4 *)
     ((long)(end->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
            m_data.array + 0x1c) = uVar16;
    interpolation<Eigen::Quaternion<double,_0>_>::lerp
              (&local_228,(interpolation<Eigen::Quaternion<double,_0>_> *)(this + 0xf0),begin,end,
               *(double *)(this + 0x1e0),local_238);
    *(double *)(this + 0x210) =
         local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[2];
    *(double *)(this + 0x218) =
         local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[3];
    *(double *)(this + 0x200) =
         local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[0];
    *(double *)(this + 0x208) =
         local_228.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
         m_data.array[1];
  }
  else {
    uVar8 = (ulong)(uVar6 == 0);
    lVar7 = uVar6 * 0xe0;
    dVar4 = *(double *)(this + lVar7 + 0x610 + 8);
    r_leg_pose[uVar6].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] = *(double *)(this + lVar7 + 0x610);
    r_leg_pose[uVar6].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = dVar4;
    r_leg_pose[uVar6].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] = *(double *)(this + lVar7 + 0x620);
    dVar4 = *(double *)(this + lVar7 + 0x630 + 8);
    r_leg_pose[uVar6].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[0] = *(double *)(this + lVar7 + 0x630);
    r_leg_pose[uVar6].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[1] = dVar4;
    dVar4 = *(double *)(this + lVar7 + 0x640 + 8);
    pdVar1 = r_leg_pose[uVar6].qq.m_coeffs.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array + 2
    ;
    *pdVar1 = *(double *)(this + lVar7 + 0x640);
    pdVar1[1] = dVar4;
    lVar7 = uVar8 * 0xe0;
    dVar4 = *(double *)(this + lVar7 + 0x630 + 8);
    r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[0] = *(double *)(this + lVar7 + 0x630);
    r_leg_pose[uVar8].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[1] = dVar4;
    pLVar3 = this + lVar7 + 0x640;
    uVar9 = *(undefined4 *)pLVar3;
    uVar10 = *(undefined4 *)(pLVar3 + 4);
    uVar11 = *(undefined4 *)(pLVar3 + 8);
    uVar12 = *(undefined4 *)(pLVar3 + 0xc);
LAB_00106e34:
    puVar2 = (undefined4 *)
             ((long)(r_leg_pose->qq).m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + lVar7 + 0x10);
    *puVar2 = uVar9;
    puVar2[1] = uVar10;
    puVar2[2] = uVar11;
    puVar2[3] = uVar12;
  }
LAB_00107243:
  dVar4 = *(double *)(this + uVar8 * 0xe0 + 0x610 + 8);
  r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[0] = *(double *)(this + uVar8 * 0xe0 + 0x610);
  r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[1] = dVar4;
  r_leg_pose[uVar8].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[2] = *(double *)(this + uVar8 * 0xe0 + 0x620);
  return;
}

Assistant:

void LegTrack::getLegTrack(double t, Pose r_leg_pose[]) {
  rl spl = swl == right ? left : right;
  if (ws == starting1 || ws == stopping2) {
      r_leg_pose[right].set(bfr_landpose[right]);
      r_leg_pose[left].set(bfr_landpose[left]);
  } else {
    if (t < dst_s*0.5) {
        r_leg_pose[swl].set(bfr_landpose[swl]);
        r_leg_pose[spl].set(bfr_landpose[spl].q());
    } else if (t < dst_s*0.5 + sst_s*0.5) {
        double sst_s_time = t - dst_s*0.5;
        Vector2 nex = inter_vec2.lerp(bfr, ref, sst_s, sst_s_time);
        r_leg_pose[swl].set(Vector3(nex.x(), nex.y(), inter_z_1.inter5(sst_s_time)));
        r_leg_pose[swl].set(inter_q.lerp(bfr_landpose[swl].q(), ref_landpose[swl].q(), sst_s, sst_s_time));
        r_leg_pose[spl].set(inter_q.lerp(bfr_landpose[spl].q(), ref_landpose[spl].q(), sst_s, sst_s_time));
        waist = inter_q.lerp(bfr_waist_r, ref_waist_r, sst_s, sst_s_time);
    } else if (t < dst_s*0.5 + sst_s) {
        double sst_s_time = t - dst_s*0.5;
        double sst_s_ht = sst_s_time - sst_s*0.5;
        Vector2 nex = inter_vec2.lerp(bfr, ref, sst_s, sst_s_time);
        r_leg_pose[swl].set(Vector3(nex.x(), nex.y(), inter_z_2.inter5(sst_s_ht)));
        r_leg_pose[swl].set(inter_q.lerp(bfr_landpose[swl].q(), ref_landpose[swl].q(), sst_s, sst_s_time));
        r_leg_pose[spl].set(inter_q.lerp(bfr_landpose[spl].q(), ref_landpose[spl].q(), sst_s, sst_s_time));
        waist = inter_q.lerp(bfr_waist_r, ref_waist_r, sst_s, sst_s_time);
    } else if (t <= st_s) {
        r_leg_pose[swl].set(ref_landpose[swl]);
        r_leg_pose[spl].set(ref_landpose[spl]);
    }
    r_leg_pose[spl].set(bfr_landpose[spl].p());
  }
}